

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall
wabt::WastLexer::GetNameEqNumToken
          (Token *__return_storage_ptr__,WastLexer *this,string_view name,TokenType token_type)

{
  bool bVar1;
  string_view s;
  
  bVar1 = MatchString(this,name);
  if (bVar1) {
    s.size_ = 2;
    s.data_ = "0x";
    bVar1 = MatchString(this,s);
    if (bVar1) {
      bVar1 = ReadHexNum(this);
    }
    else {
      bVar1 = ReadNum(this);
    }
    if ((bVar1 != false) && (bVar1 = NoTrailingReservedChars(this), bVar1)) {
      TextToken(__return_storage_ptr__,this,token_type,name.size_);
      return __return_storage_ptr__;
    }
  }
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNameEqNumToken(string_view name, TokenType token_type) {
  if (MatchString(name)) {
    if (MatchString("0x")) {
      if (ReadHexNum() && NoTrailingReservedChars()) {
        return TextToken(token_type, name.size());
      }
    } else if (ReadNum() && NoTrailingReservedChars()) {
      return TextToken(token_type, name.size());
    }
  }
  return GetKeywordToken();
}